

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigTransform.cpp
# Opt level: O0

void __thiscall xmrig::ConfigTransform::finalize(ConfigTransform *this,Document *doc)

{
  bool bVar1;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RSI;
  char *in_RDI;
  Value profile;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  undefined4 in_stack_ffffffffffffff18;
  Type in_stack_ffffffffffffff1c;
  BaseTransform *in_stack_ffffffffffffff20;
  Ch *in_stack_ffffffffffffff28;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff40;
  undefined1 value;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_stack_ffffffffffffff48;
  Document *in_stack_ffffffffffffff58;
  BaseTransform *in_stack_ffffffffffffff60;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  StringRefType *in_stack_ffffffffffffff78;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_ffffffffffffff80;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_68 [2];
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_48 [2];
  GenericStringRef<char> local_28;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_18;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *local_10;
  
  value = (undefined1)((ulong)in_stack_ffffffffffffff40 >> 0x38);
  local_10 = in_RSI;
  local_18 = rapidjson::
             GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             ::GetAllocator(in_RSI);
  BaseTransform::finalize
            (in_stack_ffffffffffffff20,
             (Document *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  if (*(long *)(in_RDI + 0x20) != 0) {
    in_stack_ffffffffffffff48 = local_10;
    rapidjson::GenericStringRef<char>::GenericStringRef<8u>(&local_28,(char (*) [8])0x27c3f7);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<int>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                   in_stack_ffffffffffffff68);
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    if (!bVar1) {
      rapidjson::StringRef<char>
                ((char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      value = (undefined1)((ulong)local_48 >> 0x38);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                  in_stack_ffffffffffffff68);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue(local_48);
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    rapidjson::StringRef<char>
              ((char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_long>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68);
    rapidjson::StringRef<char>
              ((char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_long>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68);
    rapidjson::StringRef<char>
              ((char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<long>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                    CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                    in_stack_ffffffffffffff68);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
    operator[]<char_const>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (char *)in_stack_ffffffffffffff68);
    rapidjson::StringRef<char>
              ((char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::GetAllocator(local_10);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
              in_stack_ffffffffffffff68);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue(local_68);
  }
  if ((in_RDI[0xd] & 1U) != 0) {
    BaseTransform::set<bool>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_RDI,
               (char *)in_stack_ffffffffffffff48,(bool)value);
  }
  return;
}

Assistant:

void xmrig::ConfigTransform::finalize(rapidjson::Document &doc)
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    BaseTransform::finalize(doc);

    if (m_threads) {
        doc.AddMember("version", 1, allocator);

        if (!doc.HasMember(kCpu)) {
            doc.AddMember(StringRef(kCpu), Value(kObjectType), allocator);
        }

        Value profile(kObjectType);
        profile.AddMember(StringRef(kIntensity), m_intensity, allocator);
        profile.AddMember(StringRef(kThreads),   m_threads, allocator);
        profile.AddMember(StringRef(kAffinity),  m_affinity, allocator);

        doc[kCpu].AddMember(StringRef(kAsterisk), profile, doc.GetAllocator());
    }

#   ifdef XMRIG_FEATURE_OPENCL
    if (m_opencl) {
        set(doc, kOcl, kEnabled, true);
    }
#   endif
}